

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

ssize_t serialize::write(int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_0000003c;
  ostream *ostream_;
  uint local_1c [2];
  uint32_t size;
  
  ostream_ = (ostream *)CONCAT44(in_register_0000003c,__fd);
  local_1c[0] = *(uint *)((long)__buf + 8);
  write<unsigned_int>(ostream_,local_1c);
  write_internal(ostream_,*__buf,*(uint32_t *)((long)__buf + 8));
  return (ssize_t)ostream_;
}

Assistant:

static inline ostream& write (ostream& ostream_, const std::string& string_)
    {
        uint32_t size = string_.size();
        write (ostream_, size);
        write_internal (ostream_, string_.c_str(), string_.size());
        return ostream_;
    }